

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O0

GLuint gl4cts::KHRDebug::LabelsTest::createSampler(Functions *gl,RenderContext *rc)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar2;
  GLuint local_1c;
  RenderContext *pRStack_18;
  GLuint id;
  RenderContext *rc_local;
  Functions *gl_local;
  
  local_1c = 0;
  pRStack_18 = rc;
  rc_local = (RenderContext *)gl;
  ctxType.super_ApiType.m_bits = (ApiType)(*rc->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (bVar1) {
    (*(code *)rc_local[0x7d]._vptr_RenderContext)(1,&local_1c);
    dVar2 = (*(code *)rc_local[0x100]._vptr_RenderContext)();
    glu::checkError(dVar2,"CreateSamplers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x401);
  }
  else {
    (*(code *)rc_local[0xde]._vptr_RenderContext)(1,&local_1c);
    (*(code *)rc_local[0x15]._vptr_RenderContext)(0,local_1c);
    (*(code *)rc_local[0x15]._vptr_RenderContext)(0);
    dVar2 = (*(code *)rc_local[0x100]._vptr_RenderContext)();
    glu::checkError(dVar2,"GenSamplers / BindSampler",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x408);
  }
  return local_1c;
}

Assistant:

GLuint LabelsTest::createSampler(const Functions* gl, const glu::RenderContext* rc)
{
	GLuint id = 0;
	if (glu::contextSupports(rc->getType(), glu::ApiType::core(4, 5)))
	{
		gl->createSamplers(1, &id);
		GLU_EXPECT_NO_ERROR(gl->getError(), "CreateSamplers");
	}
	else
	{
		gl->genSamplers(1, &id);
		gl->bindSampler(0, id);
		gl->bindSampler(0, 0);
		GLU_EXPECT_NO_ERROR(gl->getError(), "GenSamplers / BindSampler");
	}

	return id;
}